

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

void __thiscall
HighsLp::deleteColsFromVectors
          (HighsLp *this,HighsInt *new_num_col,HighsIndexCollection *index_collection)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer pdVar3;
  pointer pHVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  HighsInt keep_to_col;
  HighsInt current_set_entry;
  HighsInt keep_from_col;
  HighsInt delete_to_col;
  HighsInt delete_from_col;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt local_80;
  int local_7c;
  HighsInt local_78;
  int local_74;
  int local_70;
  HighsInt local_6c;
  int local_68;
  uint local_64;
  ulong local_60;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  pointer local_48;
  pointer local_40;
  HighsIndexCollection *local_38;
  
  limits(index_collection,(HighsInt *)&local_64,&local_68);
  local_7c = this->num_col_;
  *new_num_col = local_7c;
  if ((int)local_64 <= local_68) {
    local_80 = -1;
    local_78 = 0;
    *new_num_col = 0;
    local_50 = &this->col_names_;
    local_40 = (this->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = &this->integrality_;
    pHVar1 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pHVar2 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_7c = local_7c + -1;
    uVar6 = local_64;
    local_38 = index_collection;
    while( true ) {
      iVar5 = local_7c;
      local_60 = (ulong)uVar6;
      updateOutInIndex(index_collection,&local_6c,&local_70,&local_74,&local_80,&local_78);
      uVar7 = (uint)local_60;
      if (uVar7 == local_64) {
        *new_num_col = local_6c;
      }
      if (iVar5 <= local_70) break;
      if (local_74 <= local_80) {
        iVar5 = *new_num_col;
        lVar8 = (long)local_74 + -1;
        do {
          pdVar3 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar5] = pdVar3[lVar8 + 1];
          pdVar3 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar5] = pdVar3[lVar8 + 1];
          pdVar3 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar5] = pdVar3[lVar8 + 1];
          if (local_48 != local_40) {
            std::__cxx11::string::_M_assign
                      ((string *)
                       ((local_50->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + iVar5));
            iVar5 = *new_num_col;
          }
          if (pHVar1 != pHVar2) {
            pHVar4 = (local_58->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pHVar4[iVar5] = pHVar4[lVar8 + 1];
          }
          iVar5 = iVar5 + 1;
          *new_num_col = iVar5;
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_80);
        uVar7 = (uint)local_60;
        index_collection = local_38;
      }
      if ((local_7c <= local_80) || (uVar6 = uVar7 + 1, local_68 <= (int)uVar7)) break;
    }
    std::vector<double,_std::allocator<double>_>::resize(&this->col_cost_,(long)*new_num_col);
    std::vector<double,_std::allocator<double>_>::resize(&this->col_lower_,(long)*new_num_col);
    std::vector<double,_std::allocator<double>_>::resize(&this->col_upper_,(long)*new_num_col);
    if (pHVar1 != pHVar2) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize(local_58,(long)*new_num_col);
    }
    if (local_48 != local_40) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_50,(long)*new_num_col);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteColsFromVectors(
    HighsInt& new_num_col, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_col in case none is removed due to from_k > to_k
  new_num_col = this->num_col_;
  if (from_k > to_k) return;

  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  HighsInt col_dim = this->num_col_;
  new_num_col = 0;
  bool have_names = (this->col_names_.size() != 0);
  bool have_integrality = (this->integrality_.size() != 0);
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    // Account for the initial columns being kept
    if (k == from_k) new_num_col = delete_from_col;
    if (delete_to_col >= col_dim - 1) break;
    assert(delete_to_col < col_dim);
    for (HighsInt col = keep_from_col; col <= keep_to_col; col++) {
      this->col_cost_[new_num_col] = this->col_cost_[col];
      this->col_lower_[new_num_col] = this->col_lower_[col];
      this->col_upper_[new_num_col] = this->col_upper_[col];
      if (have_names) this->col_names_[new_num_col] = this->col_names_[col];
      if (have_integrality)
        this->integrality_[new_num_col] = this->integrality_[col];
      new_num_col++;
    }
    if (keep_to_col >= col_dim - 1) break;
  }
  this->col_cost_.resize(new_num_col);
  this->col_lower_.resize(new_num_col);
  this->col_upper_.resize(new_num_col);
  if (have_integrality) this->integrality_.resize(new_num_col);
  if (have_names) this->col_names_.resize(new_num_col);
}